

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O0

string * __thiscall
uWS::ExtensionsNegotiator<true>::generateOffer_abi_cxx11_(ExtensionsNegotiator<true> *this)

{
  uint *in_RSI;
  string *in_RDI;
  string *extensionsOffer;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (((*in_RSI & 1) != 0) &&
     (std::__cxx11::string::operator+=((string *)in_RDI,"permessage-deflate"), (*in_RSI & 4) != 0))
  {
    std::__cxx11::string::operator+=((string *)in_RDI,"; client_no_context_takeover");
  }
  return in_RDI;
}

Assistant:

std::string generateOffer() {
        std::string extensionsOffer;
        if (options & Options::PERMESSAGE_DEFLATE) {
            extensionsOffer += "permessage-deflate";

            if (options & Options::CLIENT_NO_CONTEXT_TAKEOVER) {
                extensionsOffer += "; client_no_context_takeover";
            }

            /* It is questionable sending this improves anything */
            /*if (options & Options::SERVER_NO_CONTEXT_TAKEOVER) {
                extensionsOffer += "; server_no_context_takeover";
            }*/
        }

        return extensionsOffer;
    }